

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapePrism> *this,TPZCompMesh *mesh,
          TPZCompElH1<pzshape::TPZShapePrism> *copy)

{
  long in_RDX;
  TPZRegisterClassId *in_RDI;
  TPZManVector<long,_21> *in_stack_ffffffffffffffc8;
  TPZCompMesh *in_stack_ffffffffffffffd0;
  void **vtt;
  TPZManVector<long,_21> *this_00;
  
  this_00 = (TPZManVector<long,_21> *)0x0;
  vtt = (void **)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZIntelGen<pzshape::TPZShapePrism>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02513e58);
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen
            ((TPZIntelGen<pzshape::TPZShapePrism> *)this_00,vtt,in_stack_ffffffffffffffd0,
             (TPZIntelGen<pzshape::TPZShapePrism> *)in_stack_ffffffffffffffc8);
  *(undefined ***)in_RDI = &PTR__TPZCompElH1_02513a40;
  *(undefined ***)in_RDI = &PTR__TPZCompElH1_02513a40;
  TPZManVector<long,_21>::TPZManVector(this_00,(int64_t)vtt,(long *)in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI + 0x138) = *(undefined4 *)(in_RDX + 0x138);
  TPZManVector<long,_21>::operator=
            ((TPZManVector<long,_21> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::TPZCompElH1(TPZCompMesh &mesh, const TPZCompElH1<TSHAPE> &copy) : TPZRegisterClassId(&TPZCompElH1::ClassId),
                                                                                       TPZIntelGen<TSHAPE>(mesh,copy), fh1fam(copy.fh1fam){
	this->fConnectIndexes = copy.fConnectIndexes;
}